

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadratictetra.cpp
# Opt level: O2

void pzgeom::TPZQuadraticTetra::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  Fad<double> *pFVar1;
  undefined1 local_178 [16];
  double dStack_168;
  Fad<double> *local_160;
  undefined1 local_158 [8];
  Fad<double> *local_150;
  double *pdStack_148;
  Fad<double> *local_140;
  undefined1 local_138 [8];
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *local_130;
  double *pdStack_128;
  Fad<double> *local_120;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_118;
  undefined1 local_108 [8];
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *local_100;
  double *pdStack_f8;
  undefined1 local_f0 [8];
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *local_e8;
  double *pdStack_e0;
  Fad<double> *local_d8;
  Fad<double> qsi;
  Fad<double> zeta;
  Fad<double> eta;
  undefined1 *local_70;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
  *local_68;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
  local_60;
  Fad<double> *local_50;
  Fad<double> *local_48;
  Fad<double> **local_40;
  Fad<double> *local_38;
  
  Fad<double>::Fad(&qsi,par->fStore);
  Fad<double>::Fad(&eta,par->fStore + 1);
  Fad<double>::Fad(&zeta,par->fStore + 2);
  local_40 = &local_50;
  local_f0 = (undefined1  [8])&local_40;
  local_120 = &qsi;
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_f0;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pdStack_e0 = (double *)0x0;
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_150 = (Fad<double> *)0x4000000000000000;
  pdStack_148 = (double *)0x0;
  local_60.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&local_70;
  local_60.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x4000000000000000;
  pdStack_128 = (double *)0x0;
  local_108 = (undefined1  [8])&local_60;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x3ff0000000000000;
  pdStack_f8 = (double *)0x0;
  local_160 = &zeta;
  local_140 = &eta;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_108;
  local_70 = local_178;
  local_68 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
              *)local_158;
  local_50 = &zeta;
  local_48 = &eta;
  local_38 = local_120;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>_>_>
                     *)&local_118);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_158 = (undefined1  [8])local_178;
  local_138 = (undefined1  [8])local_160;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_160 = &eta;
  local_158 = (undefined1  [8])local_178;
  local_138 = (undefined1  [8])&eta;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,2,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = 2.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_158 = (undefined1  [8])local_178;
  local_138 = (undefined1  [8])local_160;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,3,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&zeta;
  local_158 = (undefined1  [8])local_f0;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_138 = (undefined1  [8])local_178;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  local_108 = (undefined1  [8])local_160;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_f0 = (undefined1  [8])local_108;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,4,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  local_158 = (undefined1  [8])local_178;
  local_150 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,5,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)local_158);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_108 = (undefined1  [8])&qsi;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&zeta;
  local_158 = (undefined1  [8])local_f0;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_160 = &eta;
  local_138 = (undefined1  [8])local_178;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_f0 = (undefined1  [8])local_108;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,6,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  local_108 = (undefined1  [8])&qsi;
  local_158 = (undefined1  [8])local_f0;
  local_150 = (Fad<double> *)0x3ff0000000000000;
  pdStack_148 = (double *)0x0;
  local_138 = (undefined1  [8])local_178;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)local_158;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_f0 = (undefined1  [8])local_108;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_160;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,7,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_138);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  local_150 = &zeta;
  local_158 = (undefined1  [8])local_178;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,8,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)local_158);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &eta;
  local_158 = (undefined1  [8])local_178;
  local_150 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(phi,9,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                     *)local_158);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &qsi;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x4010000000000000;
  pdStack_128 = (double *)0x0;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x4010000000000000;
  pdStack_e0 = (double *)0x0;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_f0;
  local_160 = (Fad<double> *)local_158;
  local_120 = &eta;
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  local_108 = (undefined1  [8])&local_118;
  local_d8 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_108);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &qsi;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x4010000000000000;
  pdStack_128 = (double *)0x0;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x4010000000000000;
  pdStack_e0 = (double *)0x0;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_f0;
  local_160 = (Fad<double> *)local_158;
  local_120 = &eta;
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  local_108 = (undefined1  [8])&local_118;
  local_d8 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_108);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &qsi;
  local_178._8_8_ = -3.0;
  dStack_168 = 0.0;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x4010000000000000;
  pdStack_128 = (double *)0x0;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)0x4010000000000000;
  pdStack_e0 = (double *)0x0;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_f0;
  local_160 = (Fad<double> *)local_158;
  local_120 = &eta;
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)local_178;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_138;
  local_108 = (undefined1  [8])&local_118;
  local_d8 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,0);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_108);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &qsi;
  local_178._8_8_ = -1.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,1);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,1);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,2);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_178._8_8_ = -1.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_158;
  local_140 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,2);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,2);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,3);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,3);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_178._8_8_ = -1.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_158;
  local_140 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,3);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_178);
  local_150 = (Fad<double> *)0x4000000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &qsi;
  local_138 = (undefined1  [8])local_f0;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x3ff0000000000000;
  pdStack_128 = (double *)0x0;
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_138;
  local_108 = (undefined1  [8])local_158;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_f0 = (undefined1  [8])local_108;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,4);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
                     *)local_178);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,4);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,4);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,5);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,5);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,5);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,6);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&qsi;
  local_108 = (undefined1  [8])&local_118;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x3ff0000000000000;
  pdStack_128 = (double *)0x0;
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_138;
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &eta;
  local_138 = (undefined1  [8])local_108;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&zeta;
  local_f0 = (undefined1  [8])local_178;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,6);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_f0);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,6);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,7);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,7);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_118.fadexpr_.left_ =
       (FadExpr<FadBinaryAdd<FadCst<double>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
        *)&qsi;
  local_108 = (undefined1  [8])&local_118;
  local_130 = (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadCst<double>_>_>
               *)0x3ff0000000000000;
  pdStack_128 = (double *)0x0;
  local_178._8_8_ = -4.0;
  dStack_168 = 0.0;
  local_160 = (Fad<double> *)local_138;
  local_150 = (Fad<double> *)0x4010000000000000;
  pdStack_148 = (double *)0x0;
  local_140 = &zeta;
  local_138 = (undefined1  [8])local_108;
  local_118.fadexpr_.right_ = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&eta;
  local_100 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)&zeta;
  local_f0 = (undefined1  [8])local_178;
  local_e8 = (FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_158;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,7);
  Fad<double>::operator=
            (pFVar1,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>
                     *)local_f0);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,8);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,8);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &qsi;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,8);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._0_8_ = 0.0;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,0,9);
  Fad<double>::operator=<double,_nullptr>(pFVar1,(double *)local_178);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &zeta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,1,9);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  local_178._8_8_ = 4.0;
  dStack_168 = 0.0;
  local_160 = &eta;
  pFVar1 = TPZFMatrix<Fad<double>_>::operator()(dphi,2,9);
  Fad<double>::operator=(pFVar1,(FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *)local_178);
  Fad<double>::~Fad(&zeta);
  Fad<double>::~Fad(&eta);
  Fad<double>::~Fad(&qsi);
  return;
}

Assistant:

void TPZQuadraticTetra::TShape(const TPZVec<T> &par, TPZFMatrix<T> &phi, TPZFMatrix<T> &dphi)
{
	T qsi = par[0], eta = par[1], zeta = par[2];
	
    phi(0,0)  =  (zeta + eta + qsi -1.) * (2.*zeta + 2.*eta + 2.*qsi - 1.);
//    phi(0,0)  =  (qsi + eta + zeta -1.) * (2.*qsi + 2.*eta + 2.*zeta - 1.);
//    phi(0,0)  =  2.*qsi*qsi + 2.*eta*eta + 2.*zeta*zeta + 4.*qsi*eta + 4.*qsi*zeta + 4.*eta*zeta - 3.*qsi - 3.*eta - 3.*zeta + 1.;
	phi(1,0)  =  qsi  * (2.*qsi - 1.);
	phi(2,0)  =  eta  * (2.*eta - 1.);
	phi(3,0)  =  zeta * (2.*zeta - 1.);
	phi(4,0)  = -4.*qsi  * (qsi + eta + zeta -1.);
	phi(5,0)  =  4.*qsi  *  eta;
	phi(6,0)  = -4.*eta  * (qsi + eta + zeta -1.);
	phi(7,0)  = -4.*zeta * (qsi + eta + zeta -1.);
	phi(8,0)  =  4.*qsi  *  zeta;
	phi(9,0)  =  4.*eta  *  zeta;
	
	dphi(0,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(1,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(2,0) =  -3. + 4.*qsi + 4.*eta + 4.*zeta;
	dphi(0,1) =  -1. + 4.*qsi;
	dphi(1,1) =   0.;
	dphi(2,1) =   0.;
	dphi(0,2) =   0.;
	dphi(1,2) =  -1. + 4.*eta;
	dphi(2,2) =   0.;
	dphi(0,3) =   0.;
	dphi(1,3) =   0.;
	dphi(2,3) =  -1. + 4.*zeta;
	dphi(0,4) =  -4.*(2.*qsi + eta + zeta - 1.);
	dphi(1,4) =  -4.*qsi;
	dphi(2,4) =  -4.*qsi;
	dphi(0,5) =   4.*eta;
	dphi(1,5) =   4.*qsi;
	dphi(2,5) =   0.;
	dphi(0,6) =  -4.*eta;
	dphi(1,6) =  -4.*(qsi + eta + zeta - 1.)-4.*eta;
	dphi(2,6) =  -4.*eta;
	dphi(0,7) =  -4.*zeta;
	dphi(1,7) =  -4.*zeta;
	dphi(2,7) =  -4.*(qsi + eta + zeta - 1.)-4.*zeta;
	dphi(0,8) =   4.*zeta;
	dphi(1,8) =   0.;
	dphi(2,8) =   4.*qsi;
	dphi(0,9) =   0.;
	dphi(1,9) =   4.*zeta;
	dphi(2,9) =   4.*eta;
}